

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msaa.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint value;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLint GVar5;
  GLFWwindow *handle;
  float angle;
  double dVar6;
  float y;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  float z;
  int height;
  int width;
  uint local_110;
  GLuint vertex_buffer;
  float local_108;
  float local_104 [12];
  undefined8 local_d4;
  undefined4 local_cc;
  float local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  mat4x4 mvp;
  mat4x4 m;
  
  value = 4;
  while( true ) {
    iVar1 = getopt(argc,argv,"hs:");
    if (iVar1 != 0x73) break;
    value = atoi(optarg);
  }
  if (iVar1 == -1) {
    local_110 = value;
    glfwSetErrorCallback(error_callback);
    iVar1 = glfwInit();
    if (iVar1 != 0) {
      if (value == 0) {
        puts("Requesting that MSAA not be available");
      }
      else {
        printf("Requesting MSAA with %i samples\n",(ulong)value);
      }
      glfwWindowHint(0x2100d,value);
      glfwWindowHint(0x22002,2);
      glfwWindowHint(0x22003,0);
      handle = glfwCreateWindow(800,400,"Aliasing Detector",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle != (GLFWwindow *)0x0) {
        glfwSetKeyCallback(handle,key_callback);
        glfwMakeContextCurrent(handle);
        gladLoadGLLoader(glfwGetProcAddress);
        glfwSwapInterval(1);
        (*glad_glGetIntegerv)(0x80a9,(GLint *)&local_110);
        if (local_110 == 0) {
          puts("Context reports MSAA is unavailable");
        }
        else {
          printf("Context reports MSAA is available with %i samples\n");
        }
        (*glad_glGenBuffers)(1,&vertex_buffer);
        (*glad_glBindBuffer)(0x8892,vertex_buffer);
        (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
        GVar2 = (*glad_glCreateShader)(0x8b31);
        (*glad_glShaderSource)(GVar2,1,&vertex_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar2);
        GVar3 = (*glad_glCreateShader)(0x8b30);
        (*glad_glShaderSource)(GVar3,1,&fragment_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar3);
        GVar4 = (*glad_glCreateProgram)();
        (*glad_glAttachShader)(GVar4,GVar2);
        (*glad_glAttachShader)(GVar4,GVar3);
        (*glad_glLinkProgram)(GVar4);
        GVar5 = (*glad_glGetUniformLocation)(GVar4,"MVP");
        GVar2 = (*glad_glGetAttribLocation)(GVar4,"vPos");
        (*glad_glEnableVertexAttribArray)(GVar2);
        (*glad_glVertexAttribPointer)(GVar2,2,0x1406,'\0',8,(void *)0x0);
        while( true ) {
          iVar1 = glfwWindowShouldClose(handle);
          if (iVar1 != 0) break;
          dVar6 = glfwGetTime();
          glfwGetFramebufferSize(handle,&width,&height);
          local_c8 = (float)width / (float)height;
          uStack_c4 = in_XMM1_Db;
          uStack_c0 = in_XMM1_Dc;
          uStack_bc = in_XMM1_Dd;
          (*glad_glViewport)(0,0,width,height);
          (*glad_glClear)(0x4000);
          (*glad_glUseProgram)(GVar4);
          local_108 = 2.0 / (local_c8 + local_c8);
          local_104[0] = 0.0;
          local_104[1] = 0.0;
          local_104[2] = 0.0;
          local_104[3] = 0.0;
          local_104[10] = 0.0;
          local_104[8] = 0.0;
          local_104[9] = -2.0;
          local_104[4] = 1.0;
          local_104[5] = 0.0;
          local_104[6] = 0.0;
          local_104[7] = 0.0;
          in_XMM1_Db = uStack_c4 ^ 0x80000000;
          in_XMM1_Dc = uStack_c0 ^ 0x80000000;
          in_XMM1_Dd = uStack_bc ^ 0x80000000;
          y = -(local_c8 - local_c8) / (local_c8 + local_c8);
          local_d4 = 0xbf80000080000000;
          local_cc = 0x3f800000;
          z = local_c8;
          local_104[0xb] = y;
          mat4x4_translate(m,-1.0,y,local_c8);
          angle = (float)((dVar6 * 3.141592653589793) / 180.0);
          mat4x4_rotate_Z(m,m,angle);
          mat4x4_mul(mvp,(vec4 *)&local_108,m);
          (*glad_glUniformMatrix4fv)(GVar5,1,'\0',mvp[0]);
          (*glad_glDisable)(0x809d);
          (*glad_glDrawArrays)(6,0,4);
          mat4x4_translate(m,1.0,y,z);
          mat4x4_rotate_Z(m,m,angle);
          mat4x4_mul(mvp,(vec4 *)&local_108,m);
          (*glad_glUniformMatrix4fv)(GVar5,1,'\0',mvp[0]);
          (*glad_glEnable)(0x809d);
          (*glad_glDrawArrays)(6,0,4);
          glfwSwapBuffers(handle);
          glfwPollEvents();
        }
        glfwDestroyWindow(handle);
        glfwTerminate();
        goto LAB_00113b71;
      }
      glfwTerminate();
    }
  }
  else {
    if (iVar1 == 0x68) {
      usage();
LAB_00113b71:
      exit(0);
    }
    usage();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, samples = 4;
    GLFWwindow* window;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    while ((ch = getopt(argc, argv, "hs:")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 's':
                samples = atoi(optarg);
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (samples)
        printf("Requesting MSAA with %i samples\n", samples);
    else
        printf("Requesting that MSAA not be available\n");

    glfwWindowHint(GLFW_SAMPLES, samples);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(800, 400, "Aliasing Detector", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    glGetIntegerv(GL_SAMPLES, &samples);
    if (samples)
        printf("Context reports MSAA is available with %i samples\n", samples);
    else
        printf("Context reports MSAA is unavailable\n");

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    while (!glfwWindowShouldClose(window))
    {
        float ratio;
        int width, height;
        mat4x4 m, p, mvp;
        const double angle = glfwGetTime() * M_PI / 180.0;

        glfwGetFramebufferSize(window, &width, &height);
        ratio = width / (float) height;

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        glUseProgram(program);

        mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 0.f, 1.f);

        mat4x4_translate(m, -1.f, 0.f, 0.f);
        mat4x4_rotate_Z(m, m, (float) angle);
        mat4x4_mul(mvp, p, m);

        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glDisable(GL_MULTISAMPLE);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        mat4x4_translate(m, 1.f, 0.f, 0.f);
        mat4x4_rotate_Z(m, m, (float) angle);
        mat4x4_mul(mvp, p, m);

        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glEnable(GL_MULTISAMPLE);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}